

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

Node * __thiscall wasm::DataFlow::Graph::doVisitBinary(Graph *this,Binary *curr)

{
  BinaryOp BVar1;
  Node *pNVar2;
  Node *value;
  Node *pNVar3;
  Binary *curr_00;
  Builder local_30;
  Builder builder;
  
  BVar1 = curr->op;
  if ((ulong)BVar1 < 0x32) {
    if ((0x3ffffe1fffffU >> ((ulong)BVar1 & 0x3f) & 1) == 0) {
      local_30.wasm = this->module;
      switch(BVar1) {
      case GtSInt32:
        BVar1 = LtSInt32;
        break;
      case GtUInt32:
        BVar1 = LtUInt32;
        break;
      case GeSInt32:
        BVar1 = LeSInt32;
        break;
      case GeUInt32:
        BVar1 = LeUInt32;
        break;
      default:
        switch(BVar1) {
        case GtSInt64:
          BVar1 = LtSInt64;
          break;
        case GtUInt64:
          BVar1 = LtUInt64;
          break;
        case GeSInt64:
          BVar1 = LeSInt64;
          break;
        case GeUInt64:
          BVar1 = LeUInt64;
          break;
        default:
          handle_unreachable("unexpected op",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/dataflow/graph.h"
                             ,0x22b);
        }
      }
      curr_00 = Builder::makeBinary(&local_30,BVar1,curr->right,curr->left);
      pNVar2 = visitExpression(this,(Expression *)curr_00);
      pNVar2->origin = (Expression *)curr;
    }
    else {
      pNVar2 = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                         ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->left)
      ;
      value = expandFromI1(this,pNVar2,(Expression *)curr);
      pNVar2 = value;
      if (value->type != Bad) {
        pNVar2 = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                           ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,
                            curr->right);
        pNVar2 = expandFromI1(this,pNVar2,(Expression *)curr);
        if (pNVar2->type != Bad) {
          pNVar3 = Node::makeExpr((Expression *)curr,(Expression *)curr);
          pNVar3 = addNode(this,pNVar3);
          Node::addValue(pNVar3,value);
          Node::addValue(pNVar3,pNVar2);
          pNVar2 = pNVar3;
        }
      }
    }
    return pNVar2;
  }
  pNVar2 = makeVar(this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)16>).
                              super_Expression.type.id);
  return pNVar2;
}

Assistant:

Node* doVisitBinary(Binary* curr) {
    // First, check if we support this op.
    switch (curr->op) {
      case AddInt32:
      case AddInt64:
      case SubInt32:
      case SubInt64:
      case MulInt32:
      case MulInt64:
      case DivSInt32:
      case DivSInt64:
      case DivUInt32:
      case DivUInt64:
      case RemSInt32:
      case RemSInt64:
      case RemUInt32:
      case RemUInt64:
      case AndInt32:
      case AndInt64:
      case OrInt32:
      case OrInt64:
      case XorInt32:
      case XorInt64:
      case ShlInt32:
      case ShlInt64:
      case ShrUInt32:
      case ShrUInt64:
      case ShrSInt32:
      case ShrSInt64:
      case RotLInt32:
      case RotLInt64:
      case RotRInt32:
      case RotRInt64:
      case EqInt32:
      case EqInt64:
      case NeInt32:
      case NeInt64:
      case LtSInt32:
      case LtSInt64:
      case LtUInt32:
      case LtUInt64:
      case LeSInt32:
      case LeSInt64:
      case LeUInt32:
      case LeUInt64: {
        // These are ok as-is.
        // Check if our children are supported.
        auto* left = expandFromI1(visit(curr->left), curr);
        if (left->isBad()) {
          return left;
        }
        auto* right = expandFromI1(visit(curr->right), curr);
        if (right->isBad()) {
          return right;
        }
        // Great, we are supported!
        auto* ret = addNode(Node::makeExpr(curr, curr));
        ret->addValue(left);
        ret->addValue(right);
        return ret;
      }
      case GtSInt32:
      case GtSInt64:
      case GeSInt32:
      case GeSInt64:
      case GtUInt32:
      case GtUInt64:
      case GeUInt32:
      case GeUInt64: {
        // These need to be flipped as Souper does not support redundant ops.
        Builder builder(*module);
        BinaryOp opposite;
        switch (curr->op) {
          case GtSInt32:
            opposite = LtSInt32;
            break;
          case GtSInt64:
            opposite = LtSInt64;
            break;
          case GeSInt32:
            opposite = LeSInt32;
            break;
          case GeSInt64:
            opposite = LeSInt64;
            break;
          case GtUInt32:
            opposite = LtUInt32;
            break;
          case GtUInt64:
            opposite = LtUInt64;
            break;
          case GeUInt32:
            opposite = LeUInt32;
            break;
          case GeUInt64:
            opposite = LeUInt64;
            break;
          default:
            WASM_UNREACHABLE("unexpected op");
        }
        auto* ret =
          visitBinary(builder.makeBinary(opposite, curr->right, curr->left));
        // We just created a new binary node, but we need to set the origin
        // properly to the original.
        ret->origin = curr;
        return ret;
      }
      default: {
        // Anything else is an unknown value.
        return makeVar(curr->type);
      }
    }
  }